

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O2

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CCompoundStm *statement)

{
  IStatement *pIVar1;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> _Var2;
  CSeqStatement *this_00;
  ISubtreeWrapper *pIVar3;
  CExpStatement *this_01;
  CConstExpression *this_02;
  pointer *__ptr;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_48;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_40;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_38;
  type leftStatement;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_28;
  
  std::operator<<((ostream *)&std::cout,"IRT builder: CCompound\n");
  pIVar1 = (statement->leftStatement)._M_t.
           super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t.
           super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
           super__Head_base<0UL,_IStatement_*,_false>._M_head_impl;
  if (pIVar1 == (IStatement *)0x0) {
    pIVar3 = (ISubtreeWrapper *)operator_new(0x10);
    this_01 = (CExpStatement *)operator_new(0x10);
    this_02 = (CConstExpression *)operator_new(0x10);
    IRT::CConstExpression::CConstExpression(this_02,0);
    local_28._M_head_impl = (CExpression *)this_02;
    IRT::CExpStatement::CExpStatement
              (this_01,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                        *)&local_28);
    pIVar3->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_0017b4c8;
    pIVar3[1]._vptr_ISubtreeWrapper = (_func_int **)this_01;
    updateSubtreeWrapper(this,pIVar3);
    if ((CConstExpression *)local_28._M_head_impl != (CConstExpression *)0x0) {
      (*(((CExpression *)&(local_28._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
  }
  else {
    (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
    leftStatement._M_t.
    super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
    super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
    super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl =
         (__uniq_ptr_data<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>,_true,_true>
          )(this->wrapper)._M_t.
           super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>.
           _M_t.
           super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
           .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
    (this->wrapper)._M_t.
    super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
    super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
    super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = (ISubtreeWrapper *)0x0;
    pIVar1 = (statement->rightStatement)._M_t.
             super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t.
             super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
             super__Head_base<0UL,_IStatement_*,_false>._M_head_impl;
    (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
    pIVar3 = (this->wrapper)._M_t.
             super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
             .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
    if (pIVar3 == (ISubtreeWrapper *)0x0) {
      pIVar3 = (ISubtreeWrapper *)operator_new(0x10);
      (**(code **)(*(long *)leftStatement._M_t.
                            super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
                            .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl + 8))
                (&local_48);
      _Var2._M_head_impl = local_48._M_head_impl;
      local_48._M_head_impl = (CStatement *)0x0;
      pIVar3->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_0017b4c8;
      pIVar3[1]._vptr_ISubtreeWrapper = (_func_int **)_Var2._M_head_impl;
      updateSubtreeWrapper(this,pIVar3);
      if (local_48._M_head_impl != (CStatement *)0x0) {
        (*((local_48._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
      }
    }
    else {
      (*pIVar3->_vptr_ISubtreeWrapper[1])(&local_48);
      _Var2._M_head_impl = local_48._M_head_impl;
      this_00 = (CSeqStatement *)operator_new(0x18);
      (**(code **)(*(long *)leftStatement._M_t.
                            super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
                            .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl + 8))
                (&local_48);
      local_38._M_head_impl = local_48._M_head_impl;
      local_48._M_head_impl = (CStatement *)0x0;
      local_40._M_head_impl = _Var2._M_head_impl;
      IRT::CSeqStatement::CSeqStatement
                (this_00,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                          *)&local_38,
                 (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                 &local_40);
      if (local_40._M_head_impl != (CStatement *)0x0) {
        (*((local_40._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
      }
      local_40._M_head_impl = (CStatement *)0x0;
      if (local_38._M_head_impl != (CStatement *)0x0) {
        (*((local_38._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
      }
      local_38._M_head_impl = (CStatement *)0x0;
      if (local_48._M_head_impl != (CStatement *)0x0) {
        (*((local_48._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
      }
      pIVar3 = (ISubtreeWrapper *)operator_new(0x10);
      pIVar3->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_0017b4c8;
      pIVar3[1]._vptr_ISubtreeWrapper = (_func_int **)this_00;
      updateSubtreeWrapper(this,pIVar3);
    }
    std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::~unique_ptr
              (&leftStatement);
  }
  return;
}

Assistant:

void CBuildVisitor::Visit( CCompoundStm &statement ) {
    std::cout << "IRT builder: CCompound\n";
    if ( statement.leftStatement == NULL ) {
        // fake statement
        updateSubtreeWrapper( new IRT::CStatementWrapper( std::move( std::unique_ptr<const IRT::CStatement>(
                new IRT::CExpStatement(
                        std::move( std::unique_ptr<const IRT::CExpression>( new IRT::CConstExpression( 0 )))
                )
        ))));
    } else {
        statement.leftStatement->Accept( *this );
        auto leftStatement = std::move( wrapper );
        statement.rightStatement->Accept( *this );

        if ( wrapper ) {
            std::unique_ptr<const IRT::CStatement> rightStatement = std::move( wrapper->ToStatement( ));
            std::unique_ptr<const IRT::CStatement> compound = std::move( std::unique_ptr<const IRT::CStatement>(
                    new IRT::CSeqStatement( std::move( leftStatement->ToStatement( )), std::move( rightStatement ))));
            updateSubtreeWrapper( new IRT::CStatementWrapper( std::move( compound )));
        } else {
            updateSubtreeWrapper( new IRT::CStatementWrapper( std::move( leftStatement->ToStatement( ))));
        }
    }
}